

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O0

void diy::
     Serialization<std::vector<diy::AMRLink::Description,_std::allocator<diy::AMRLink::Description>_>_>
     ::save(BinaryBuffer *bb,Vector *v)

{
  Description *x;
  const_reference n;
  vector<diy::AMRLink::Description,_std::allocator<diy::AMRLink::Description>_> *in_RSI;
  size_t s;
  unsigned_long *in_stack_ffffffffffffffd8;
  BinaryBuffer *in_stack_ffffffffffffffe0;
  
  x = (Description *)
      std::vector<diy::AMRLink::Description,_std::allocator<diy::AMRLink::Description>_>::size
                (in_RSI);
  save<unsigned_long>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (x != (Description *)0x0) {
    n = std::vector<diy::AMRLink::Description,_std::allocator<diy::AMRLink::Description>_>::
        operator[](in_RSI,0);
    std::vector<diy::AMRLink::Description,_std::allocator<diy::AMRLink::Description>_>::size(in_RSI)
    ;
    save<diy::AMRLink::Description>((BinaryBuffer *)in_RSI,x,(size_t)n);
  }
  return;
}

Assistant:

static void         save(BinaryBuffer& bb, const Vector& v)
    {
      size_t s = v.size();
      diy::save(bb, s);
      if (s > 0)
        diy::save(bb, &v[0], v.size());
    }